

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall Js::ByteCodeWriter::Data::SlowWrite(Data *this,void *data,uint byteSize)

{
  DataChunk *pDVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  DataChunk *this_00;
  uint byteSize_00;
  
  uVar4 = DataChunk::RemainingBytes(this->current);
  if (byteSize <= uVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xd83,"(byteSize > current->RemainingBytes())",
                                "We should not need an extension if there is enough space in the current chunk"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this_00 = this->current;
  pDVar1 = this_00->nextChunk;
  if (pDVar1 != (DataChunk *)0x0) {
    pDVar1->currentByte = pDVar1->buffer;
  }
  while( true ) {
    uVar4 = DataChunk::RemainingBytes(this_00);
    byteSize_00 = byteSize - uVar4;
    if (byteSize < uVar4 || byteSize_00 == 0) break;
    DataChunk::WriteUnsafe(this->current,data,uVar4);
    this_00 = this->current->nextChunk;
    if (this_00 == (DataChunk *)0x0) {
      AddChunk(this,byteSize_00);
      this_00 = this->current->nextChunk;
    }
    data = (void *)((long)data + (ulong)uVar4);
    this->current = this_00;
    byteSize = byteSize_00;
  }
  DataChunk::WriteUnsafe(this->current,data,byteSize);
  return;
}

Assistant:

_NOINLINE void ByteCodeWriter::Data::SlowWrite(__in_bcount(byteSize) const void* data, __in uint byteSize)
    {
        AssertMsg(byteSize > current->RemainingBytes(), "We should not need an extension if there is enough space in the current chunk");
        uint bytesLeftToWrite = byteSize;
        byte* dataToBeWritten = (byte*)data;
        // the next chunk may already be created in the case that we are patching bytecode.
        // If so, we want to move the pointer to the beginning of the buffer
        if (current->nextChunk)
        {
            current->nextChunk->SetCurrentOffset(0);
        }
        while (true)
        {
            uint bytesFree = current->RemainingBytes();
            if (bytesFree >= bytesLeftToWrite)
            {
                current->WriteUnsafe(dataToBeWritten, bytesLeftToWrite);
                break;
            }

            current->WriteUnsafe(dataToBeWritten, bytesFree);
            bytesLeftToWrite -= bytesFree;
            dataToBeWritten += bytesFree;

            // Create a new chunk when needed
            if (!current->nextChunk)
            {
                AddChunk(bytesLeftToWrite);
            }
            current = current->nextChunk;
        }
    }